

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::NormalGetRealName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmTarget *pcVar3;
  string msg;
  size_type __dnew;
  Names local_f8;
  size_type local_38;
  
  pcVar3 = this->Target;
  paVar1 = &local_f8.Base.field_2;
  if (pcVar3->IsImportedTarget == true) {
    local_38 = 0x2d;
    local_f8.Base._M_dataplus._M_p = (pointer)paVar1;
    local_f8.Base._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_f8,(ulong)&local_38);
    local_f8.Base.field_2._M_allocated_capacity = local_38;
    builtin_strncpy(local_f8.Base._M_dataplus._M_p,"NormalGetRealName called on imported target: ",
                    0x2d);
    local_f8.Base._M_string_length = local_38;
    local_f8.Base._M_dataplus._M_p[local_38] = '\0';
    std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(this->Target->Name)._M_dataplus._M_p);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_f8.Base);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Base._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8.Base._M_dataplus._M_p,local_f8.Base.field_2._M_allocated_capacity + 1
                     );
    }
    pcVar3 = this->Target;
  }
  if (pcVar3->TargetTypeValue == EXECUTABLE) {
    GetExecutableNames(&local_f8,this,config);
  }
  else {
    GetLibraryNames(&local_f8,this,config);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar2 = &local_f8.Real.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.Real._M_dataplus._M_p == paVar2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_f8.Real.field_2._M_allocated_capacity._1_7_,
                  local_f8.Real.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f8.Real.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_f8.Real._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_f8.Real.field_2._M_allocated_capacity._1_7_,
                  local_f8.Real.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_f8.Real._M_string_length;
  local_f8.Real._M_string_length = 0;
  local_f8.Real.field_2._M_local_buf[0] = '\0';
  local_f8.Real._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.SharedObject._M_dataplus._M_p != &local_f8.SharedObject.field_2) {
    operator_delete(local_f8.SharedObject._M_dataplus._M_p,
                    local_f8.SharedObject.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.PDB._M_dataplus._M_p != &local_f8.PDB.field_2) {
    operator_delete(local_f8.PDB._M_dataplus._M_p,local_f8.PDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.ImportLibrary._M_dataplus._M_p != &local_f8.ImportLibrary.field_2) {
    operator_delete(local_f8.ImportLibrary._M_dataplus._M_p,
                    local_f8.ImportLibrary.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.Real._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8.Real._M_dataplus._M_p,
                    CONCAT71(local_f8.Real.field_2._M_allocated_capacity._1_7_,
                             local_f8.Real.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.Output._M_dataplus._M_p != &local_f8.Output.field_2) {
    operator_delete(local_f8.Output._M_dataplus._M_p,
                    local_f8.Output.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.Base._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.Base._M_dataplus._M_p,local_f8.Base.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetRealName(
  const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "NormalGetRealName called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Compute the real name that will be built.
    return this->GetExecutableNames(config).Real;
  }
  // Compute the real name that will be built.
  return this->GetLibraryNames(config).Real;
}